

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O3

int evfilt_vnode_knote_create(filter *filt,knote *kn)

{
  int iVar1;
  stat_conflict sb;
  stat local_a0;
  
  iVar1 = fstat((int)(kn->kev).ident,&local_a0);
  if (-1 < iVar1) {
    (kn->field_10).kn_vnode.nlink = local_a0.st_nlink;
    (kn->field_10).kn_vnode.size = local_a0.st_size;
    (kn->kev).data = -1;
    iVar1 = add_watch(filt,kn);
    return iVar1;
  }
  return -1;
}

Assistant:

int
evfilt_vnode_knote_create(struct filter *filt, struct knote *kn)
{
    struct stat sb;

    if (fstat(kn->kev.ident, &sb) < 0) {
        dbg_puts("fstat failed");
        return (-1);
    }
    kn->kn_vnode.nlink = sb.st_nlink;
    kn->kn_vnode.size = sb.st_size;
    kn->kev.data = -1;

    return (add_watch(filt, kn));
}